

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

bool __thiscall wabt::WastParser::ParseElemExprListOpt(WastParser *this,ElemExprVector *out_list)

{
  pointer pEVar1;
  pointer pEVar2;
  bool bVar3;
  ElemExpr elem_expr;
  ElemExpr local_70;
  
  ElemExpr::ElemExpr(&local_70);
  while( true ) {
    bVar3 = ParseElemExprOpt(this,&local_70);
    if (!bVar3) break;
    std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>::push_back(out_list,&local_70);
  }
  pEVar1 = (out_list->super__Vector_base<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pEVar2 = (out_list->super__Vector_base<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  Var::~Var(&local_70.var);
  return pEVar1 != pEVar2;
}

Assistant:

bool WastParser::ParseElemExprListOpt(ElemExprVector* out_list) {
  ElemExpr elem_expr;
  while (ParseElemExprOpt(&elem_expr)) {
    out_list->push_back(elem_expr);
  }
  return !out_list->empty();
}